

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::sdiv(APInt *this,APInt *RHS)

{
  bool bVar1;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  APInt AVar3;
  APInt local_c0;
  APInt local_b0;
  APInt local_a0;
  APInt local_90;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  APInt local_30;
  APInt *local_20;
  APInt *RHS_local;
  APInt *this_local;
  undefined8 uVar2;
  
  local_20 = in_RDX;
  RHS_local = RHS;
  this_local = this;
  bVar1 = isNegative(RHS);
  if (bVar1) {
    bVar1 = isNegative(local_20);
    if (bVar1) {
      APInt(&local_40,RHS);
      llvm::operator-((llvm *)&local_30,&local_40);
      APInt(&local_60,local_20);
      llvm::operator-((llvm *)&local_50,&local_60);
      udiv(this,&local_30);
      ~APInt(&local_50);
      ~APInt(&local_60);
      ~APInt(&local_30);
      ~APInt(&local_40);
      uVar2 = extraout_RDX;
    }
    else {
      APInt(&local_90,RHS);
      llvm::operator-((llvm *)&local_80,&local_90);
      udiv(&local_70,&local_80);
      llvm::operator-((llvm *)this,&local_70);
      ~APInt(&local_70);
      ~APInt(&local_80);
      ~APInt(&local_90);
      uVar2 = extraout_RDX_00;
    }
  }
  else {
    bVar1 = isNegative(local_20);
    if (bVar1) {
      APInt(&local_c0,local_20);
      llvm::operator-((llvm *)&local_b0,&local_c0);
      udiv(&local_a0,RHS);
      llvm::operator-((llvm *)this,&local_a0);
      ~APInt(&local_a0);
      ~APInt(&local_b0);
      ~APInt(&local_c0);
      uVar2 = extraout_RDX_01;
    }
    else {
      AVar3 = udiv(this,RHS);
      uVar2 = AVar3._8_8_;
    }
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::sdiv(const APInt &RHS) const {
  if (isNegative()) {
    if (RHS.isNegative())
      return (-(*this)).udiv(-RHS);
    return -((-(*this)).udiv(RHS));
  }
  if (RHS.isNegative())
    return -(this->udiv(-RHS));
  return this->udiv(RHS);
}